

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void __thiscall CVmBigNumCache::release_all(CVmBigNumCache *this)

{
  CVmBigNumCache *in_RDI;
  size_t i;
  ulong local_10;
  
  for (local_10 = 0; local_10 < in_RDI->max_regs_; local_10 = local_10 + 1) {
    release_reg(in_RDI,(uint)local_10);
  }
  return;
}

Assistant:

void CVmBigNumCache::release_all()
{
    size_t i;

    /* mark each of our registers as not in use */
    for (i = 0 ; i < max_regs_ ; ++i)
        release_reg(i);
}